

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1.c
# Opt level: O2

int http1_on_http_version(http1_parser_s *parser,char *version,size_t len)

{
  uint8_t **ppuVar1;
  FIOBJ FVar2;
  timespec tVar3;
  
  FVar2 = fiobj_str_new(version,len);
  parser[2].state.read = FVar2;
  ppuVar1 = &parser[4].state.next;
  *ppuVar1 = *ppuVar1 + len;
  tVar3 = fio_last_tick();
  *(timespec *)&parser[1].state.next = tVar3;
  return 0;
}

Assistant:

static int http1_on_http_version(http1_parser_s *parser, char *version,
                                 size_t len) {
  http1_pr2handle(parser2http(parser)).version = fiobj_str_new(version, len);
  parser2http(parser)->header_size += len;
/* start counting - occurs on the first line of both requests and responses */
#if FIO_HTTP_EXACT_LOGGING
  clock_gettime(CLOCK_REALTIME,
                &http1_pr2handle(parser2http(parser)).received_at);
#else
  http1_pr2handle(parser2http(parser)).received_at = fio_last_tick();
#endif
  return 0;
}